

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
* __thiscall
phmap::priv::
node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
::operator=(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
            *this,node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
                  *other)

{
  bool bVar1;
  allocator<std::pair<const_int,_int>_> *__args;
  allocator_type *alloc;
  slot_type *new_slot;
  slot_type *old_slot;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
  *other_local;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_local;
  
  destroy(this);
  bVar1 = empty(other);
  if (!bVar1) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)other);
    if (bVar1) {
      __args = std::optional<std::allocator<std::pair<const_int,_int>_>_>::value(&other->alloc_);
      std::optional<std::allocator<std::pair<int_const,int>>>::
      emplace<std::allocator<std::pair<int_const,int>>&>
                ((optional<std::allocator<std::pair<int_const,int>>> *)this,__args);
    }
    alloc = node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,_int>,_void>,_std::allocator<std::pair<const_int,_int>_>_>
            ::alloc(this);
    new_slot = slot(this);
    old_slot = slot(other);
    hash_policy_traits<phmap::priv::FlatHashMapPolicy<int,int>,void>::
    transfer<std::allocator<std::pair<int_const,int>>>(alloc,new_slot,old_slot);
    reset(other);
  }
  return this;
}

Assistant:

node_handle_base& operator=(node_handle_base&& other) noexcept {
        destroy();
        if (!other.empty()) {
            if (other.alloc_) {
               alloc_.emplace(other.alloc_.value());
            }
            PolicyTraits::transfer(alloc(), slot(), other.slot());
            other.reset();
        }
        return *this;
    }